

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

void __thiscall
despot::util::tinyxml::TiXmlDeclaration::operator=(TiXmlDeclaration *this,TiXmlDeclaration *copy)

{
  TiXmlNode::Clear(&this->super_TiXmlNode);
  CopyTo(copy,this);
  return;
}

Assistant:

void TiXmlDeclaration::operator=(const TiXmlDeclaration& copy) {
	Clear();
	copy.CopyTo(this);
}